

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_png(char *filename,int x,int y,int comp,void *data,int stride_bytes)

{
  uchar *mode;
  FILE *__s;
  uchar *png;
  int len;
  FILE *f;
  int in_stack_00000040;
  int in_stack_00000044;
  uchar *in_stack_00000048;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 local_4;
  
  mode = stbi_write_png_to_mem
                   (in_stack_00000048,in_stack_00000044,in_stack_00000040,filename._4_4_,
                    (int)filename,(int *)CONCAT44(x,y));
  if (mode == (uchar *)0x0) {
    local_4 = 0;
  }
  else {
    __s = (FILE *)stbiw__fopen((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                               ,(char *)mode);
    if (__s == (FILE *)0x0) {
      free(mode);
      local_4 = 0;
    }
    else {
      fwrite(mode,1,(long)in_stack_ffffffffffffffc4,__s);
      fclose(__s);
      free(mode);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

STBIWDEF int stbi_write_png(char const *filename, int x, int y, int comp, const void *data, int stride_bytes)
{
   FILE *f;
   int len;
   unsigned char *png = stbi_write_png_to_mem((const unsigned char *) data, stride_bytes, x, y, comp, &len);
   if (png == NULL) return 0;

   f = stbiw__fopen(filename, "wb");
   if (!f) { STBIW_FREE(png); return 0; }
   fwrite(png, 1, len, f);
   fclose(f);
   STBIW_FREE(png);
   return 1;
}